

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

void mqc_encode(opj_mqc_t *mqc,int d)

{
  uint uVar1;
  int iVar2;
  opj_mqc_state_t *poVar3;
  opj_mqc_state *poVar4;
  uint uVar5;
  
  poVar3 = *mqc->curctx;
  uVar1 = poVar3->qeval;
  uVar5 = mqc->a - uVar1;
  iVar2 = poVar3->mps;
  mqc->a = uVar5;
  if (iVar2 == d) {
    if ((short)uVar5 < 0) {
      mqc->c = mqc->c + uVar1;
      return;
    }
    if (uVar5 < uVar1) {
      mqc->a = uVar1;
    }
    else {
      mqc->c = mqc->c + uVar1;
    }
    poVar4 = poVar3->nmps;
  }
  else {
    if (uVar5 < uVar1) {
      mqc->c = mqc->c + uVar1;
    }
    else {
      mqc->a = uVar1;
    }
    poVar4 = poVar3->nlps;
  }
  *mqc->curctx = poVar4;
  mqc_renorme(mqc);
  return;
}

Assistant:

void mqc_encode(opj_mqc_t *mqc, int d) {
	if ((*mqc->curctx)->mps == d) {
		mqc_codemps(mqc);
	} else {
		mqc_codelps(mqc);
	}
}